

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

void __thiscall
boost::deflate::deflate_stream_test::doDeflate2_beast
          (deflate_stream_test *this,ICompressor *c,int level,int windowBits,int memLevel,
          int strategy,string *check)

{
  runner *prVar1;
  wrap wrap;
  bool bVar2;
  __type cond;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined4 extraout_var;
  runner **pprVar6;
  char *msg;
  undefined4 extraout_var_00;
  long lVar7;
  undefined4 extraout_var_01;
  bool local_131;
  undefined1 local_f0 [16];
  string local_e0;
  string local_c0;
  error_code local_a0;
  error_code local_90;
  undefined1 local_80 [8];
  error_code ec;
  int local_68;
  bool bo;
  bool bi;
  undefined1 local_58 [8];
  string out;
  size_t j;
  size_t i;
  int strategy_local;
  int memLevel_local;
  int windowBits_local;
  int level_local;
  ICompressor *c_local;
  deflate_stream_test *this_local;
  
  j = 1;
LAB_0011231d:
  uVar4 = std::__cxx11::string::size();
  if (uVar4 <= j) {
    return;
  }
  out.field_2._8_8_ = 1;
  do {
    (*c->_vptr_ICompressor[1])
              (c,(ulong)(uint)level,(ulong)(uint)windowBits,(ulong)(uint)memLevel,
               (ulong)(uint)strategy);
    std::__cxx11::string::string((string *)local_58);
    uVar5 = std::__cxx11::string::size();
    (*c->_vptr_ICompressor[0xb])(c,uVar5);
    std::__cxx11::string::resize((ulong)local_58);
    uVar5 = out.field_2._8_8_;
    uVar4 = std::__cxx11::string::size();
    if ((ulong)uVar5 < uVar4) {
      uVar5 = std::__cxx11::string::data();
      (*c->_vptr_ICompressor[5])(c,uVar5);
      (*c->_vptr_ICompressor[3])(c,j);
      uVar5 = std::__cxx11::string::data();
      (*c->_vptr_ICompressor[9])(c,uVar5);
      (*c->_vptr_ICompressor[7])(c,out.field_2._8_8_);
      ec.cat_._7_1_ = 0;
      ec.cat_._6_1_ = 0;
      while( true ) {
        iVar3 = (*c->_vptr_ICompressor[0xc])(c,(ulong)((ec.cat_._7_1_ & 1) << 2));
        local_80 = (undefined1  [8])CONCAT44(extraout_var,iVar3);
        system::error_code::error_code<boost::deflate::error>(&local_90,need_buffers,(type *)0x0);
        wrap = system::operator==((error_code *)local_80,&local_90);
        local_131 = true;
        if (!(bool)wrap) {
          system::error_code::error_code<boost::deflate::error>(&local_a0,end_of_stream,(type *)0x0)
          ;
          local_131 = system::operator==((error_code *)local_80,&local_a0);
        }
        if (local_131 != false) break;
        pprVar6 = test_suite::detail::current();
        prVar1 = *pprVar6;
        bVar2 = system::error_code::operator_cast_to_bool((error_code *)local_80);
        system::error_code::message_abi_cxx11_(&local_c0,(error_code *)local_80);
        msg = (char *)std::__cxx11::string::c_str();
        bVar2 = test_suite::detail::runner::maybe_fail<bool>
                          (prVar1,!bVar2,"! ec",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
                           ,0x177,
                           "void boost::deflate::deflate_stream_test::doDeflate2_beast(ICompressor &, int, int, int, int, const std::string &)"
                           ,msg);
        std::__cxx11::string::~string((string *)&local_c0);
        if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00112711;
        iVar3 = (*c->_vptr_ICompressor[2])();
        if ((CONCAT44(extraout_var_00,iVar3) == 0) && ((ec.cat_._7_1_ & 1) == 0)) {
          ec.cat_._7_1_ = 1;
          lVar7 = std::__cxx11::string::size();
          (*c->_vptr_ICompressor[3])(c,lVar7 - j);
        }
        iVar3 = (*c->_vptr_ICompressor[6])();
        if ((CONCAT44(extraout_var_01,iVar3) == 0) && ((ec.cat_._6_1_ & 1) == 0)) {
          ec.cat_._6_1_ = 1;
          lVar7 = std::__cxx11::string::size();
          (*c->_vptr_ICompressor[7])(c,lVar7 - out.field_2._8_8_);
        }
      }
      (*c->_vptr_ICompressor[10])();
      std::__cxx11::string::resize((ulong)local_58);
      pprVar6 = test_suite::detail::current();
      prVar1 = *pprVar6;
      basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      decompress_abi_cxx11_
                ((string *)(local_f0 + 0x10),(deflate_stream_test *)local_f0,(string_view *)0x0,wrap
                );
      cond = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_f0 + 0x10),check);
      test_suite::detail::runner::maybe_fail<bool>
                (prVar1,cond,"decompress(out) == check",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
                 ,0x187,
                 "void boost::deflate::deflate_stream_test::doDeflate2_beast(ICompressor &, int, int, int, int, const std::string &)"
                 ,(char *)0x0);
      std::__cxx11::string::~string((string *)(local_f0 + 0x10));
LAB_00112711:
      local_68 = 0;
    }
    else {
      local_68 = 5;
    }
    std::__cxx11::string::~string((string *)local_58);
    if (local_68 != 0) break;
    out.field_2._8_8_ = out.field_2._8_8_ + 1;
  } while( true );
  j = j + 1;
  goto LAB_0011231d;
}

Assistant:

void doDeflate2_beast(
        ICompressor& c,
        int level, int windowBits, int memLevel,
        int strategy, std::string const& check)
    {
        for(std::size_t i = 1; i < check.size(); ++i)
        {
            for(std::size_t j = 1;; ++j)
            {
                c.init(
                    level,
                    windowBits,
                    memLevel,
                    strategy);
                std::string out;
                out.resize(c.bound(check.size()));
                if(j >= out.size())
                    break;
                c.next_in((void*)check.data());
                c.avail_in(i);
                c.next_out((void*)out.data());
                c.avail_out(j);
                bool bi = false;
                bool bo = false;
                for(;;)
                {
                    error_code ec = c.write(
                        bi ? Flush::full : Flush::none);
                    if( ec == error::need_buffers ||
                        ec == error::end_of_stream) // per zlib FAQ
                        goto fin;
                    if(! BOOST_TESTS(! ec, ec.message().c_str()))
                        goto err;
                    if(c.avail_in() == 0 && ! bi)
                    {
                        bi = true;
                        c.avail_in(check.size() - i);
                    }
                    if(c.avail_out() == 0 && ! bo)
                    {
                        bo = true;
                        c.avail_out(out.size() - j);
                    }
                }

            fin:
                out.resize(c.total_out());
                BOOST_TEST(decompress(out) == check);

            err:
                ;
            }
        }
    }